

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_meta___index(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  int iVar3;
  CType *ct;
  ulong uVar4;
  CTState *cts;
  CTInfo qual;
  uint8_t *p;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  qual = 0;
  pTVar1 = L->base;
  if ((pTVar1 + 1 < L->top) && ((pTVar1->field_2).it == 0xfffffff5)) {
    ct = lj_cdata_index(cts,(GCcdata *)(ulong)(pTVar1->u32).lo,pTVar1 + 1,&p,&qual);
    if ((qual & 1) == 0) {
      iVar2 = lj_cdata_get(cts,ct,L->top + -1,p);
      iVar3 = 1;
      if ((iVar2 != 0) &&
         (uVar4 = (ulong)(L->glref).ptr32, *(uint *)(uVar4 + 0x54) <= *(uint *)(uVar4 + 0x50))) {
        lj_gc_step(L);
      }
    }
    else {
      iVar3 = ffi_index_meta(L,cts,ct,MM_index);
    }
    return iVar3;
  }
  lj_err_argt(L,1,10);
}

Assistant:

LJLIB_CF(ffi_meta___index)	LJLIB_REC(cdata_index 0)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+1 < L->top && tviscdata(o)))  /* Also checks for presence of key. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1))
    return ffi_index_meta(L, cts, ct, MM_index);
  if (lj_cdata_get(cts, ct, L->top-1, p))
    lj_gc_check(L);
  return 1;
}